

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorUnits
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  TextureChannelClass TVar1;
  tcu local_e8 [16];
  Vector<float,_4> local_d8;
  tcu local_c8 [16];
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined1 local_68 [8];
  TextureFormatInfo texFormatInfo;
  Vec4 *normalizedRange_local;
  TextureFormat *texFormat_local;
  
  texFormatInfo.lookupBias.m_data._8_8_ = normalizedRange;
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_68,texFormat);
  TVar1 = tcu::getTextureChannelClass(texFormat->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    tcu::operator*((tcu *)&local_88,(Vector<float,_4> *)texFormatInfo.lookupBias.m_data._8_8_,2.0);
    tcu::operator-((tcu *)&local_78,&local_88,1.0);
    rr::GenericVec4::GenericVec4<float>((GenericVec4 *)&texFormat_local,&local_78);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    rr::GenericVec4::GenericVec4<float>
              ((GenericVec4 *)&texFormat_local,
               (Vector<float,_4> *)texFormatInfo.lookupBias.m_data._8_8_);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    tcu::mix<float,4>(local_c8,(Vector<float,_4> *)local_68,
                      (Vector<float,_4> *)(texFormatInfo.valueMin.m_data + 2),
                      (Vector<float,_4> *)texFormatInfo.lookupBias.m_data._8_8_);
    tcu::Vector<float,_4>::cast<int>(&local_b8);
    rr::GenericVec4::GenericVec4<int>((GenericVec4 *)&texFormat_local,(Vector<int,_4> *)&local_b8);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    tcu::mix<float,4>(local_e8,(Vector<float,_4> *)local_68,
                      (Vector<float,_4> *)(texFormatInfo.valueMin.m_data + 2),
                      (Vector<float,_4> *)texFormatInfo.lookupBias.m_data._8_8_);
    tcu::Vector<float,_4>::cast<unsigned_int>(&local_d8);
    rr::GenericVec4::GenericVec4<unsigned_int>
              ((GenericVec4 *)&texFormat_local,(Vector<unsigned_int,_4> *)&local_d8);
    break;
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    tcu::operator*((tcu *)&local_a8,(Vector<float,_4> *)texFormatInfo.lookupBias.m_data._8_8_,
                   (Vector<float,_4> *)(texFormatInfo.valueMin.m_data + 2));
    tcu::operator+((tcu *)&local_98,(Vector<float,_4> *)local_68,&local_a8);
    rr::GenericVec4::GenericVec4<float>((GenericVec4 *)&texFormat_local,&local_98);
    break;
  default:
    rr::GenericVec4::GenericVec4((GenericVec4 *)&texFormat_local);
  }
  return (GenericVec4)_texFormat_local;
}

Assistant:

rr::GenericVec4 mapToFormatColorUnits (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	const tcu::TextureFormatInfo texFormatInfo = tcu::getTextureFormatInfo(texFormat);

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange);
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange * 2.0f - 1.0f);
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:			return rr::GenericVec4(texFormatInfo.valueMin + normalizedRange * texFormatInfo.valueMax);
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deInt32>());
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deUint32>());

		default:
			DE_ASSERT(false);
			return rr::GenericVec4();
	}
}